

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetWindowPos(ImGuiWindow *window,ImVec2 *pos,ImGuiCond cond)

{
  ImVec2 IVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImVec2 IVar6;
  float fVar7;
  ImVec2 IVar8;
  
  if ((cond == 0) || (((char)*(uint *)&window->field_0xaf & cond) != 0)) {
    *(uint *)&window->field_0xaf = *(uint *)&window->field_0xaf & 0xfffffff1;
    (window->SetWindowPosVal).x = 3.4028235e+38;
    (window->SetWindowPosVal).y = 3.4028235e+38;
    IVar6.x = (float)(int)(*pos).x;
    IVar6.y = (float)(int)(*pos).y;
    IVar8 = window->Pos;
    IVar1 = (window->DC).CursorPos;
    window->Pos = IVar6;
    fVar5 = IVar6.x - IVar8.x;
    fVar7 = IVar6.y - IVar8.y;
    IVar8.x = IVar1.x + fVar5;
    IVar8.y = IVar1.y + fVar7;
    (window->DC).CursorPos = IVar8;
    IVar8 = (window->DC).IdealMaxPos;
    IVar1.y = IVar8.y + fVar7;
    IVar1.x = IVar8.x + fVar5;
    (window->DC).IdealMaxPos = IVar1;
    fVar2 = (window->DC).CursorStartPos.y;
    fVar3 = (window->DC).CursorMaxPos.x;
    fVar4 = (window->DC).CursorMaxPos.y;
    (window->DC).CursorStartPos.x = (window->DC).CursorStartPos.x + fVar5;
    (window->DC).CursorStartPos.y = fVar2 + fVar7;
    (window->DC).CursorMaxPos.x = fVar3 + fVar5;
    (window->DC).CursorMaxPos.y = fVar4 + fVar7;
  }
  return;
}

Assistant:

void ImGui::SetWindowPos(ImGuiWindow* window, const ImVec2& pos, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowPosAllowFlags & cond) == 0)
        return;

    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    window->SetWindowPosAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);
    window->SetWindowPosVal = ImVec2(FLT_MAX, FLT_MAX);

    // Set
    const ImVec2 old_pos = window->Pos;
    window->Pos = ImFloor(pos);
    ImVec2 offset = window->Pos - old_pos;
    window->DC.CursorPos += offset;         // As we happen to move the window while it is being appended to (which is a bad idea - will smear) let's at least offset the cursor
    window->DC.CursorMaxPos += offset;      // And more importantly we need to offset CursorMaxPos/CursorStartPos this so ContentSize calculation doesn't get affected.
    window->DC.IdealMaxPos += offset;
    window->DC.CursorStartPos += offset;
}